

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
fmt::v6::internal::vformat<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__)

{
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> buffer;
  undefined **local_808;
  undefined1 *local_800;
  long local_7f8;
  long local_7f0;
  undefined1 local_7e8 [2000];
  
  local_7f8 = 0;
  local_808 = &PTR_grow_00221c30;
  local_7f0 = 500;
  local_800 = local_7e8;
  vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
            (&local_808);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,local_800,local_800 + local_7f8 * 4);
  local_808 = &PTR_grow_00221c30;
  if (local_800 != local_7e8) {
    operator_delete(local_800,local_7f0 << 2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<Char> internal::vformat(
    basic_string_view<Char> format_str,
    basic_format_args<buffer_context<Char>> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}